

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

void NextContext(CPpmd7 *p)

{
  uint *puVar1;
  Byte BVar2;
  byte bVar3;
  undefined2 uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  undefined4 uVar8;
  CPpmd_State *pCVar9;
  uint uVar10;
  uint uVar11;
  CPpmd7_Context *pCVar12;
  CTX_PTR_conflict pCVar13;
  undefined4 *puVar14;
  void *pvVar15;
  Byte *pBVar16;
  byte bVar17;
  Byte *pBVar18;
  Byte *pBVar19;
  short sVar20;
  CPpmd_Void_Ref *pCVar21;
  uint uVar22;
  long lVar23;
  ulong uVar24;
  short sVar25;
  uint uVar26;
  uint uVar27;
  CPpmd7_Context *pCVar28;
  ulong uStack_38;
  
  if ((p->OrderFall == 0) &&
     (uVar26._0_2_ = p->FoundState->SuccessorLow, uVar26._2_2_ = p->FoundState->SuccessorHigh,
     pCVar12 = (CPpmd7_Context *)(p->Base + uVar26), (CPpmd7_Context *)p->Text < pCVar12)) {
    p->MaxContext = pCVar12;
    p->MinContext = pCVar12;
    return;
  }
  pCVar9 = p->FoundState;
  uVar10._0_2_ = pCVar9->SuccessorLow;
  uVar10._2_2_ = pCVar9->SuccessorHigh;
  if ((pCVar9->Freq < 0x1f) && (uVar24 = (ulong)p->MinContext->Suffix, uVar24 != 0)) {
    pBVar16 = p->Base;
    if (*(short *)(pBVar16 + uVar24) == 1) {
      if (pBVar16[uVar24 + 3] < 0x20) {
        pBVar16[uVar24 + 3] = pBVar16[uVar24 + 3] + 1;
      }
    }
    else {
      pBVar19 = pBVar16 + *(uint *)(pBVar16 + uVar24 + 4);
      if (pBVar16[*(uint *)(pBVar16 + uVar24 + 4)] != pCVar9->Symbol) {
        do {
          pBVar18 = pBVar19;
          pBVar19 = pBVar18 + 6;
        } while (pBVar18[6] != pCVar9->Symbol);
        if (pBVar18[1] <= pBVar18[7]) {
          uVar4 = *(undefined2 *)(pBVar18 + 10);
          uVar8 = *(undefined4 *)pBVar19;
          *(undefined2 *)(pBVar18 + 10) = *(undefined2 *)(pBVar18 + 4);
          *(undefined4 *)pBVar19 = *(undefined4 *)pBVar18;
          *(undefined2 *)(pBVar18 + 4) = uVar4;
          *(undefined4 *)pBVar18 = uVar8;
          pBVar19 = pBVar18;
        }
      }
      if (pBVar19[1] < 0x73) {
        pBVar19[1] = pBVar19[1] + 2;
        *(short *)(pBVar16 + uVar24 + 2) = *(short *)(pBVar16 + uVar24 + 2) + 2;
      }
    }
  }
  if (p->OrderFall == 0) {
    pCVar13 = CreateSuccessors(p,1);
    p->MaxContext = pCVar13;
    p->MinContext = pCVar13;
    if (pCVar13 != (CTX_PTR_conflict)0x0) {
      *(int *)&p->FoundState->SuccessorLow = (int)pCVar13 - *(int *)&p->Base;
      return;
    }
  }
  else {
    pBVar16 = p->Text;
    BVar2 = p->FoundState->Symbol;
    p->Text = pBVar16 + 1;
    *pBVar16 = BVar2;
    if (p->Text < p->UnitsStart) {
      pBVar16 = p->Base;
      uVar26 = (int)p->Text - (int)pBVar16;
      if (uVar10 == 0) {
        *(uint *)&p->FoundState->SuccessorLow = uVar26;
        pCVar12 = p->MinContext;
        uStack_38 = (ulong)(uint)((int)pCVar12 - (int)pBVar16);
      }
      else {
        if (uVar10 <= uVar26) {
          pCVar13 = CreateSuccessors(p,0);
          if (pCVar13 == (CTX_PTR_conflict)0x0) goto LAB_0017c316;
          pBVar16 = p->Base;
          uVar10 = (int)pCVar13 - (int)pBVar16;
        }
        uStack_38 = (ulong)uVar10;
        puVar1 = &p->OrderFall;
        *puVar1 = *puVar1 - 1;
        pCVar12 = p->MinContext;
        if (*puVar1 == 0) {
          p->Text = p->Text + -(ulong)(p->MaxContext != pCVar12);
          uVar26 = uVar10;
        }
      }
      uVar5 = pCVar12->SummFreq;
      uVar6 = pCVar12->NumStats;
      uVar10 = (uint)uVar6;
      pCVar28 = p->MaxContext;
      bVar3 = p->FoundState->Freq;
      do {
        if (pCVar28 == pCVar12) {
          p->MinContext = (CPpmd7_Context *)(pBVar16 + uStack_38);
          p->MaxContext = (CPpmd7_Context *)(pBVar16 + uStack_38);
          return;
        }
        uVar7 = pCVar28->NumStats;
        if (uVar7 == 1) {
          puVar14 = (undefined4 *)AllocUnits(p,0);
          if (puVar14 == (undefined4 *)0x0) break;
          *(undefined2 *)(puVar14 + 1) = *(undefined2 *)((long)&pCVar28->Stats + 2);
          *puVar14 = *(undefined4 *)&pCVar28->SummFreq;
          pBVar16 = p->Base;
          pCVar28->Stats = (int)puVar14 - (int)pBVar16;
          bVar17 = *(byte *)((long)puVar14 + 1) * '\x02';
          if (0x1d < *(byte *)((long)puVar14 + 1)) {
            bVar17 = 0x78;
          }
          *(byte *)((long)puVar14 + 1) = bVar17;
          uVar11 = p->InitEsc + (uint)(3 < uVar10) + (uint)bVar17;
        }
        else {
          if ((uVar7 & 1) == 0) {
            uVar24 = (ulong)(uint)(uVar7 >> 1);
            bVar17 = p->Units2Indx[(uVar7 >> 1) - 1];
            if (bVar17 != p->Units2Indx[uVar24]) {
              pvVar15 = AllocUnits(p,bVar17 + 1);
              if (pvVar15 == (void *)0x0) break;
              pBVar16 = p->Base;
              uVar11 = pCVar28->Stats;
              pCVar21 = (CPpmd_Void_Ref *)(pBVar16 + uVar11);
              lVar23 = 0;
              do {
                *(undefined4 *)((long)pvVar15 + lVar23) = *(undefined4 *)((long)pCVar21 + lVar23);
                *(undefined4 *)((long)pvVar15 + lVar23 + 4) =
                     *(undefined4 *)((long)pCVar21 + lVar23 + 4);
                *(undefined4 *)((long)pvVar15 + lVar23 + 8) =
                     *(undefined4 *)((long)pCVar21 + lVar23 + 8);
                lVar23 = lVar23 + 0xc;
                uVar27 = (int)uVar24 - 1;
                uVar24 = (ulong)uVar27;
              } while (uVar27 != 0);
              *pCVar21 = p->FreeList[bVar17];
              p->FreeList[bVar17] = uVar11;
              pCVar28->Stats = (int)pvVar15 - (int)pBVar16;
            }
          }
          uVar11 = (uint)(ushort)(pCVar28->SummFreq + (ushort)((uint)uVar7 + (uint)uVar7 < uVar10))
                   + (uint)((uint)pCVar28->SummFreq <= (uint)uVar7 * 8 && (uint)uVar7 * 4 <= uVar10)
                     * 2;
        }
        pCVar9 = p->FoundState;
        uVar27 = ((uVar11 & 0xffff) + 6) * (uint)pCVar9->Freq * 2;
        uVar22 = (uVar11 & 0xffff) + ((uint)uVar5 - ((uint)bVar3 + (uint)uVar6)) + 1;
        if (uVar27 < uVar22 * 6) {
          sVar25 = 3;
          sVar20 = ((ushort)(uVar22 < uVar27) - (ushort)(uVar27 < uVar22 * 4)) + 2;
        }
        else {
          sVar25 = ((-(ushort)(uVar27 < uVar22 * 0xc) - (ushort)(uVar27 < uVar22 * 9)) + 7) -
                   (ushort)(uVar27 < uVar22 * 0xf);
          sVar20 = sVar25;
        }
        pCVar28->SummFreq = sVar25 + (short)uVar11;
        uVar11 = pCVar28->Stats;
        lVar23 = (ulong)uVar7 * 6;
        *(short *)(pBVar16 + lVar23 + 2 + (ulong)uVar11) = (short)uVar26;
        *(short *)(pBVar16 + lVar23 + 4 + (ulong)uVar11) = (short)(uVar26 >> 0x10);
        pBVar16[lVar23 + (ulong)uVar11] = pCVar9->Symbol;
        pBVar16[lVar23 + 1 + (ulong)uVar11] = (Byte)sVar20;
        pCVar28->NumStats = uVar7 + 1;
        pCVar28 = (CPpmd7_Context *)(pBVar16 + pCVar28->Suffix);
        pCVar12 = p->MinContext;
      } while( true );
    }
  }
LAB_0017c316:
  RestartModel(p);
  return;
}

Assistant:

static void NextContext(CPpmd8 *p)
{
  CTX_PTR c = CTX(SUCCESSOR(p->FoundState));
  if (p->OrderFall == 0 && (Byte *)c >= p->UnitsStart)
    p->MinContext = p->MaxContext = c;
  else
  {
    UpdateModel(p);
    p->MinContext = p->MaxContext;
  }
}